

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

bool __thiscall
HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>::
insert<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int&>
          (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
           *this,pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *args,int *args_1)

{
  ulong uVar1;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> pVar2;
  bool bVar3;
  pointer pHVar4;
  type puVar5;
  ulong uVar6;
  u64 uVar7;
  u64 uVar8;
  int *in_RDX;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *in_RSI;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *in_RDI;
  u64 distanceOfCurrentOccupant;
  u64 currentDistance;
  Entry *entryArray;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  Entry entry;
  size_t in_stack_ffffffffffffff78;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
  *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined7 in_stack_ffffffffffffffb0;
  uchar in_stack_ffffffffffffffb7;
  u64 *in_stack_ffffffffffffffb8;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
  *in_stack_ffffffffffffffc0;
  u64 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  CliqueVar in_stack_ffffffffffffffd4;
  CliqueVar in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  bool local_1;
  
  HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>::
  HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int&>
            ((HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>
              *)&stack0xffffffffffffffd4,in_RSI,in_RDX);
  HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::key
            ((HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
              *)&stack0xffffffffffffffd4);
  bVar3 = HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
          findPosition((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                        *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (KeyType *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (u8 *)in_stack_ffffffffffffffc8,(u64 *)in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8,
                       (u64 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  if (bVar3) {
    local_1 = false;
  }
  else if ((in_RDI->numElements == (in_RDI->tableSizeMask + 1) * 7 >> 3) ||
          (in_stack_ffffffffffffffc8 == in_stack_ffffffffffffffb8)) {
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
    growTable((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
               *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    local_1 = insert<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>>
                        ((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                          *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                          *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    pHVar4 = std::
             unique_ptr<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
             ::get(&in_stack_ffffffffffffff80->entries);
    in_RDI->numElements = in_RDI->numElements + 1;
    do {
      puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      bVar3 = HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
              ::occupied(in_RDI,*puVar5);
      if (!bVar3) {
        puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        *puVar5 = in_stack_ffffffffffffffb7;
        pVar2.second = in_stack_ffffffffffffffd8;
        pVar2.first = in_stack_ffffffffffffffd4;
        pHVar4[(long)in_stack_ffffffffffffffc8].key_ = pVar2;
        pHVar4[(long)in_stack_ffffffffffffffc8].value_ = in_stack_ffffffffffffffdc;
        return true;
      }
      uVar6 = (long)in_stack_ffffffffffffffc8 - (long)in_stack_ffffffffffffffc0;
      uVar1 = in_RDI->tableSizeMask;
      uVar7 = HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
              ::distanceFromIdealSlot(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (uVar7 < (uVar6 & uVar1)) {
        std::
        swap<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>>
                  ((HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                    *)in_RDI,
                   (HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                    *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        std::swap<unsigned_char>(&stack0xffffffffffffffb7,puVar5);
        in_stack_ffffffffffffff80 =
             (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
              *)((long)in_stack_ffffffffffffffc8 - uVar7 & in_RDI->tableSizeMask);
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffff80;
        uVar8 = HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                ::maxDistance();
        in_stack_ffffffffffffffb8 =
             (u64 *)((long)&(in_stack_ffffffffffffff80->entries)._M_t.
                            super___uniq_ptr_impl<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
                            .
                            super__Head_base<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_false>
                            ._M_head_impl + uVar8 & in_RDI->tableSizeMask);
      }
      in_stack_ffffffffffffffc8 =
           (u64 *)((long)in_stack_ffffffffffffffc8 + 1U & in_RDI->tableSizeMask);
    } while (in_stack_ffffffffffffffc8 != in_stack_ffffffffffffffb8);
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
    growTable((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
               *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    insert<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>>
              ((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }